

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

xml_output *
valueTagDefX(xml_output *__return_storage_ptr__,QStringList *v,QString *tagName,char *s)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (v->d).size;
  if (lVar1 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      noxml();
      return __return_storage_ptr__;
    }
  }
  else {
    local_48.d = (v->d).d;
    local_48.ptr = (v->d).ptr;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.size = lVar1;
    QString::QString((QString *)&QStack_78,"%(%1)");
    QString::arg<QString,_true>((QString *)&local_60,(QString *)&QStack_78,tagName,0,(QChar)0x20);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
    QString::QString((QString *)&QStack_78,s);
    QListSpecialMethods<QString>::join
              ((QString *)&local_60,(QListSpecialMethods<QString> *)&local_48,(QString *)&QStack_78)
    ;
    valueTag(__return_storage_ptr__,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output valueTagDefX(const QStringList &v, const QString &tagName, const char *s = " ")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(tagName));
    return valueTag(temp.join(s));
}